

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_serve_static_content.cpp
# Opt level: O1

void __thiscall
ServeStaticContent_MissingFile_Test::TestBody(ServeStaticContent_MissingFile_Test *this)

{
  pointer *__ptr;
  char *message;
  error_code eVar1;
  AssertionResult gtest_ar;
  error_or<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> actual;
  error_code local_78;
  undefined1 local_68 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  error_code local_48;
  error_or<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  
  local_68 = (undefined1  [8])&local_58;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"/foo.html","");
  anon_unknown.dwarf_11e507::ServeStaticContent::serve_path
            (&local_38,&this->super_ServeStaticContent,(string *)local_68);
  if (local_68 != (undefined1  [8])&local_58) {
    operator_delete((void *)local_68,local_58._M_allocated_capacity + 1);
  }
  eVar1 = pstore::
          error_or<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::get_error(&local_38);
  local_78._M_cat = eVar1._M_cat;
  local_78._M_value = eVar1._M_value;
  eVar1 = pstore::romfs::make_error_code(enoent);
  local_48._M_cat = eVar1._M_cat;
  local_48._M_value = eVar1._M_value;
  testing::internal::CmpHelperEQ<std::error_code,std::error_code>
            ((internal *)local_68,"actual.get_error ()",
             "make_error_code (pstore::romfs::error_code::enoent)",&local_78,&local_48);
  if (local_68[0] == (string)0x0) {
    testing::Message::Message((Message *)&local_78);
    if (local_60 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = (local_60->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/http/test_serve_static_content.cpp"
               ,0x95,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_48,(Message *)&local_78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_48);
    if ((long *)CONCAT44(local_78._4_4_,local_78._M_value) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_78._4_4_,local_78._M_value) + 8))();
    }
  }
  if (local_60 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_60,local_60);
  }
  pstore::error_or<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~error_or(&local_38);
  return;
}

Assistant:

TEST_F (ServeStaticContent, MissingFile) {
    pstore::error_or<std::string> const actual = serve_path ("/foo.html");
    EXPECT_EQ (actual.get_error (), make_error_code (pstore::romfs::error_code::enoent));
}